

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::keyValueDisplayName
          (LocaleDisplayNamesImpl *this,char *key,char *value,UnicodeString *result,UBool skipAdjust
          )

{
  short sVar1;
  int iVar2;
  char16_t *currency;
  char *locale;
  UChar *srcChars;
  int32_t length;
  UBool isChoice;
  UErrorCode sts;
  int32_t len;
  UnicodeString ustrValue;
  UBool local_71;
  UErrorCode local_70;
  int32_t local_6c;
  UnicodeString local_68;
  
  iVar2 = strcmp(key,"currency");
  if (iVar2 != 0) {
    if ((this->nameLength != UDISPCTX_LENGTH_SHORT) ||
       (ICUDataTable::get(&this->langData,"Types%short",key,value,result),
       (undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) !=
       (undefined1  [56])0x0)) {
      ICUDataTable::get(&this->langData,"Types",key,value,result);
    }
    if (skipAdjust == '\0') {
      adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
    }
    return result;
  }
  local_70 = U_ZERO_ERROR;
  UnicodeString::UnicodeString(&local_68,value,-1,kInvariant);
  local_71 = '\0';
  currency = UnicodeString::getTerminatedBuffer(&local_68);
  locale = Locale::getBaseName(&this->locale);
  srcChars = ucurr_getName_63(currency,locale,UCURR_LONG_NAME,&local_71,&local_6c,&local_70);
  if (local_70 < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::unBogus(result);
    sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (result->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(result,0,length,srcChars,0,local_6c);
    if (skipAdjust == '\0') {
      adjustForUsageAndContext(this,kCapContextUsageKeyValue,result);
    }
  }
  else {
    UnicodeString::operator=(result,&local_68);
  }
  UnicodeString::~UnicodeString(&local_68);
  return result;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::keyValueDisplayName(const char* key,
                                            const char* value,
                                            UnicodeString& result,
                                            UBool skipAdjust) const {
    if (uprv_strcmp(key, "currency") == 0) {
        // ICU4C does not have ICU4J CurrencyDisplayInfo equivalent for now.
        UErrorCode sts = U_ZERO_ERROR;
        UnicodeString ustrValue(value, -1, US_INV);
        int32_t len;
        UBool isChoice = FALSE;
        const UChar *currencyName = ucurr_getName(ustrValue.getTerminatedBuffer(),
            locale.getBaseName(), UCURR_LONG_NAME, &isChoice, &len, &sts);
        if (U_FAILURE(sts)) {
            // Return the value as is on failure
            result = ustrValue;
            return result;
        }
        result.setTo(currencyName, len);
        return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
    }

    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Types%short", key, value, result);
        if (!result.isBogus()) {
            return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
        }
    }
    langData.get("Types", key, value, result);
    return skipAdjust? result: adjustForUsageAndContext(kCapContextUsageKeyValue, result);
}